

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O1

void __thiscall ErrTest_UnknownError_Test::TestBody(ErrTest_UnknownError_Test *this)

{
  char *pcVar1;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  AssertionResult gtest_ar_;
  char buf [128];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  internal local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string local_98 [4];
  
  pcVar1 = ERR_lib_error_string(0xff000fff);
  local_a8[0] = (internal)(pcVar1 != (char *)0x0);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_98,local_a8,(AssertionResult *)"ERR_lib_error_string(err)","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x149,local_98[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
      operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  pcVar1 = ERR_reason_error_string(0xff000fff);
  local_a8[0] = (internal)(pcVar1 != (char *)0x0);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_a8[0]) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_98,local_a8,(AssertionResult *)"ERR_reason_error_string(err)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x14a,local_98[0]._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
      operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  ERR_error_string_n(0xff000fff,(char *)local_98,0x80);
  local_b0.data_._0_4_ = 0;
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       strlen((char *)local_98);
  testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
            (local_a8,"0u","strlen(buf)",(uint *)&local_b0,(unsigned_long *)&local_b8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x14d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  return;
}

Assistant:

TEST(ErrTest, UnknownError) {
  uint32_t err = ERR_PACK(0xff, 0xfff);
  EXPECT_TRUE(ERR_lib_error_string(err));
  EXPECT_TRUE(ERR_reason_error_string(err));
  char buf[128];
  ERR_error_string_n(err, buf, sizeof(buf));
  EXPECT_NE(0u, strlen(buf));
}